

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O2

void __thiscall
rsg::ValueRange::ValueRange
          (ValueRange *this,VariableType *type,ConstValueAccess *minVal,ConstValueAccess *maxVal)

{
  pointer pSVar1;
  int iVar2;
  StridedValueRead<1> local_48;
  StridedValueAccess<1> local_38;
  
  VariableType::VariableType(&this->m_type,type);
  iVar2 = VariableType::getScalarSize(type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector
            (&this->m_min,(long)iVar2,(allocator_type *)&local_48);
  iVar2 = VariableType::getScalarSize(type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector
            (&this->m_max,(long)iVar2,(allocator_type *)&local_48);
  local_48.m_type = minVal->m_type;
  local_48.m_value = minVal->m_value;
  pSVar1 = (this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.super_ConstStridedValueAccess<1>.m_value = (pointer)0x0;
  if (pSVar1 != (this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    local_38.super_ConstStridedValueAccess<1>.m_value = pSVar1;
  }
  local_38.super_ConstStridedValueAccess<1>.m_type = &this->m_type;
  StridedValueAccess<1>::operator=(&local_38,&local_48);
  local_48.m_type = maxVal->m_type;
  local_48.m_value = maxVal->m_value;
  pSVar1 = (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.super_ConstStridedValueAccess<1>.m_value = (pointer)0x0;
  if (pSVar1 != (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    local_38.super_ConstStridedValueAccess<1>.m_value = pSVar1;
  }
  local_38.super_ConstStridedValueAccess<1>.m_type = &this->m_type;
  StridedValueAccess<1>::operator=(&local_38,&local_48);
  return;
}

Assistant:

ValueRange::ValueRange (const VariableType& type, const ConstValueAccess& minVal, const ConstValueAccess& maxVal)
	: m_type		(type)
	, m_min			(type.getScalarSize())
	, m_max			(type.getScalarSize())
{
	getMin() = minVal.value();
	getMax() = maxVal.value();
}